

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O0

void optimal_init(_encode_match_data *emd)

{
  void *pvVar1;
  undefined8 *puVar2;
  interval_nodep *inpp;
  encode_match_privp data;
  _encode_match_data *emd_local;
  
  pvVar1 = malloc(0x40);
  emd->priv = pvVar1;
  pvVar1 = emd->priv;
  memset(pvVar1,0,0x40);
  *(code **)((long)pvVar1 + 0x18) = optimal_encode_int;
  *(code **)((long)pvVar1 + 0x20) = optimal_encode_int;
  puVar2 = (undefined8 *)malloc(0x40);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  puVar2[4] = 0;
  puVar2[5] = 0;
  puVar2[6] = 0;
  puVar2[7] = 0;
  *(undefined8 **)((long)pvVar1 + 0x28) = puVar2;
  *(undefined8 *)((long)pvVar1 + 0x30) = 0;
  return;
}

Assistant:

void optimal_init(encode_match_data emd)        /* IN/OUT */
{
    encode_match_privp data;
    interval_nodep *inpp;

    emd->priv = malloc(sizeof(encode_match_priv));
    data = emd->priv;

    memset(data, 0, sizeof(encode_match_priv));

    data->offset_f = optimal_encode_int;
    data->len_f = optimal_encode_int;
    inpp = malloc(sizeof(interval_nodep[8]));
    inpp[0] = NULL;
    inpp[1] = NULL;
    inpp[2] = NULL;
    inpp[3] = NULL;
    inpp[4] = NULL;
    inpp[5] = NULL;
    inpp[6] = NULL;
    inpp[7] = NULL;
    data->offset_f_priv = inpp;
    data->len_f_priv = NULL;
}